

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char[16],std::__cxx11::string,char[54],char_const*>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [16],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [54],char **args_3)

{
  char *__s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  size_t local_80;
  char *pcStack_78;
  size_t local_70;
  char (*local_68) [16];
  size_type local_60;
  pointer local_58;
  size_t local_50;
  char (*local_48) [54];
  size_t local_40;
  char *local_38;
  
  local_90._M_len = (a->View_)._M_len;
  local_90._M_str = (a->View_)._M_str;
  local_80 = (b->View_)._M_len;
  pcStack_78 = (b->View_)._M_str;
  local_70 = strlen(*args);
  local_58 = (args_1->_M_dataplus)._M_p;
  local_60 = args_1->_M_string_length;
  local_68 = args;
  local_50 = strlen(*args_2);
  __s = *args_3;
  local_48 = args_2;
  local_40 = strlen(__s);
  views._M_len = 6;
  views._M_array = &local_90;
  local_38 = __s;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}